

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O1

LY_ERR lys_compile_type_(lysc_ctx *ctx,lysp_node *context_pnode,uint16_t context_flags,
                        char *context_name,lysp_type *type_p,LY_DATA_TYPE basetype,char *tpdfname,
                        lysc_type *base,lyplg_type *plugin,ly_set *tpdf_chain,
                        uint32_t tpdf_chain_last,lysc_type **type)

{
  lysc_type *range;
  void **ppvVar1;
  int *piVar2;
  lyd_node *plVar3;
  lysp_ext_instance *plVar4;
  bool bVar5;
  bool bVar6;
  uint8_t uVar7;
  undefined1 uVar8;
  LY_ERR LVar9;
  LY_ERR LVar10;
  LY_ERR LVar11;
  lysc_type *plVar12;
  lysc_range *plVar13;
  lysc_ext_instance *plVar14;
  lysp_ext_instance *plVar15;
  lysp_ext_instance *plVar16;
  long *plVar17;
  ulong uVar18;
  char *pcVar19;
  lysc_type_bitenum_item *base_enums;
  LY_VECODE LVar20;
  LY_DATA_TYPE basetype_00;
  long lVar21;
  void *pvVar22;
  ulong uVar23;
  size_t sVar24;
  lysp_type_enum *enums_p;
  ly_ctx *plVar25;
  char *pcVar26;
  lysc_ext_instance **range_00;
  ulong uVar27;
  long lVar28;
  LY_VALUE_FORMAT local_34;
  
  plVar25 = ctx->ctx;
  *type = (lysc_type *)0x0;
  switch(basetype - LY_TYPE_BINARY) {
  case LY_TYPE_UNKNOWN:
  case LY_TYPE_BINARY:
  case LY_TYPE_UINT8:
  case LY_TYPE_UINT16:
  case LY_TYPE_UINT32:
  case LY_TYPE_STRING:
  case LY_TYPE_EMPTY:
  case LY_TYPE_ENUM:
  case LY_TYPE_IDENT:
  case LY_TYPE_LEAFREF:
  case LY_TYPE_UNION:
  case LY_TYPE_INT8:
  case LY_TYPE_INT16:
  case LY_TYPE_INT32:
    sVar24 = 0x28;
    break;
  case LY_TYPE_UINT64:
  case LY_TYPE_BOOL:
    sVar24 = 0x30;
    break;
  case LY_TYPE_BITS:
  case LY_TYPE_DEC64:
    sVar24 = 0x20;
    break;
  case LY_TYPE_INST:
    sVar24 = 0x40;
    break;
  default:
    plVar12 = (lysc_type *)0x0;
    goto LAB_00148580;
  }
  plVar12 = (lysc_type *)calloc(1,sVar24);
LAB_00148580:
  if (plVar12 == (lysc_type *)0x0) {
    LVar9 = LY_EMEM;
    ly_log(plVar25,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).");
  }
  else if (tpdfname == (char *)0x0) {
    LVar9 = LY_SUCCESS;
  }
  else {
    LVar9 = lydict_insert(plVar25,tpdfname,0,&plVar12->name);
  }
  if (LVar9 != LY_SUCCESS) {
    free(plVar12);
    goto LAB_001485f0;
  }
  *type = plVar12;
  plVar12 = *type;
  plVar12->basetype = basetype;
  plVar12->plugin = plugin;
  LVar9 = LY_SUCCESS;
  LVar11 = LY_SUCCESS;
  switch(basetype - LY_TYPE_BINARY) {
  case LY_TYPE_UNKNOWN:
    LVar11 = LVar9;
    if (type_p->length != (lysp_restr *)0x0) {
      if (base == (lysc_type *)0x0) {
        plVar13 = (lysc_range *)0x0;
      }
      else {
        plVar13 = (lysc_range *)base[1].name;
      }
      plVar12 = *type + 1;
      LVar11 = LY_SUCCESS;
      LVar9 = lys_compile_type_range
                        (ctx,type_p->length,LY_TYPE_BINARY,'\x01','\0',plVar13,
                         (lysc_range **)plVar12);
      if (LVar9 != LY_SUCCESS) goto LAB_001485f0;
      if ((tpdfname == (char *)0x0) &&
         (plVar15 = type_p->length->exts, LVar11 = LY_SUCCESS, plVar15 != (lysp_ext_instance *)0x0))
      {
        plVar14 = ((lysc_range *)plVar12->name)->exts;
        if (plVar14 == (lysc_ext_instance *)0x0) {
          pvVar22 = (void *)0x0;
          plVar17 = (long *)calloc(1,(long)plVar15[-1].exts * 0x48 + 8);
        }
        else {
          pvVar22 = plVar14[-1].compiled;
          plVar17 = (long *)realloc(&plVar14[-1].compiled,
                                    ((long)&(plVar15[-1].exts)->name +
                                    (long)plVar14[-1].compiled + (long)pvVar22) * 0x48 + 8);
        }
        if (plVar17 == (long *)0x0) {
          bVar5 = false;
          LVar11 = LY_EMEM;
          ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_compile_type_");
          bVar6 = true;
        }
        else {
          ((lysc_range *)plVar12->name)->exts = (lysc_ext_instance *)(plVar17 + 1);
          plVar14 = ((lysc_range *)plVar12->name)->exts;
          bVar5 = true;
          if (plVar14 != (lysc_ext_instance *)0x0) {
            plVar15 = type_p->length->exts;
            if (plVar15 == (lysp_ext_instance *)0x0) {
              plVar15 = (lysp_ext_instance *)0x0;
            }
            else {
              plVar15 = plVar15[-1].exts;
            }
            memset(plVar14 + *plVar17,0,((long)&plVar15->name + (long)pvVar22) * 0x48);
          }
          bVar6 = false;
          LVar11 = LY_SUCCESS;
        }
        if (bVar5) {
          lVar21 = 0;
          plVar15 = (lysp_ext_instance *)0x0;
          while( true ) {
            plVar4 = type_p->length->exts;
            if (plVar4 == (lysp_ext_instance *)0x0) {
              plVar16 = (lysp_ext_instance *)0x0;
            }
            else {
              plVar16 = plVar4[-1].exts;
            }
            if (plVar16 <= plVar15) break;
            plVar13 = (lysc_range *)plVar12->name;
            plVar14 = plVar13->exts;
            pvVar22 = plVar14[-1].compiled;
            plVar14[-1].compiled = (void *)((long)pvVar22 + 1);
            LVar11 = lys_compile_ext(ctx,(lysp_ext_instance *)((long)&plVar4->name + lVar21),
                                     plVar14 + (-(ulong)(plVar14 == (lysc_ext_instance *)0x0) |
                                               (ulong)pvVar22),plVar13);
            if (LVar11 != LY_SUCCESS) {
              if (LVar11 != LY_ENOT) goto LAB_00149c41;
              ppvVar1 = &((lysc_range *)plVar12->name)->exts[-1].compiled;
              *ppvVar1 = (void *)((long)*ppvVar1 + -1);
            }
            plVar15 = (lysp_ext_instance *)((long)&plVar15->name + 1);
            lVar21 = lVar21 + 0x70;
            LVar11 = LY_SUCCESS;
          }
          goto LAB_00149888;
        }
        goto LAB_0014988a;
      }
    }
    break;
  case LY_TYPE_BINARY:
  case LY_TYPE_UINT8:
  case LY_TYPE_UINT16:
  case LY_TYPE_UINT32:
  case LY_TYPE_UNION:
  case LY_TYPE_INT8:
  case LY_TYPE_INT16:
  case LY_TYPE_INT32:
    LVar11 = LVar9;
    if (type_p->range != (lysp_restr *)0x0) {
      if (base == (lysc_type *)0x0) {
        plVar13 = (lysc_range *)0x0;
      }
      else {
        plVar13 = (lysc_range *)base[1].name;
      }
      plVar12 = *type + 1;
      LVar11 = LY_SUCCESS;
      LVar9 = lys_compile_type_range
                        (ctx,type_p->range,basetype,'\0','\0',plVar13,(lysc_range **)plVar12);
      if (LVar9 != LY_SUCCESS) goto LAB_001485f0;
      if ((tpdfname == (char *)0x0) &&
         (plVar15 = type_p->range->exts, plVar15 != (lysp_ext_instance *)0x0)) {
        plVar14 = ((lysc_range *)plVar12->name)->exts;
        if (plVar14 == (lysc_ext_instance *)0x0) {
          pvVar22 = (void *)0x0;
          plVar17 = (long *)calloc(1,(long)plVar15[-1].exts * 0x48 + 8);
        }
        else {
          pvVar22 = plVar14[-1].compiled;
          plVar17 = (long *)realloc(&plVar14[-1].compiled,
                                    ((long)&(plVar15[-1].exts)->name +
                                    (long)plVar14[-1].compiled + (long)pvVar22) * 0x48 + 8);
        }
        if (plVar17 == (long *)0x0) {
          bVar5 = false;
          LVar11 = LY_EMEM;
          ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_compile_type_");
          bVar6 = true;
        }
        else {
          ((lysc_range *)plVar12->name)->exts = (lysc_ext_instance *)(plVar17 + 1);
          plVar14 = ((lysc_range *)plVar12->name)->exts;
          bVar5 = true;
          if (plVar14 != (lysc_ext_instance *)0x0) {
            plVar15 = type_p->range->exts;
            if (plVar15 == (lysp_ext_instance *)0x0) {
              plVar15 = (lysp_ext_instance *)0x0;
            }
            else {
              plVar15 = plVar15[-1].exts;
            }
            memset(plVar14 + *plVar17,0,((long)&plVar15->name + (long)pvVar22) * 0x48);
          }
          bVar6 = false;
          LVar11 = LY_SUCCESS;
        }
        if (bVar5) {
          lVar21 = 0;
          plVar15 = (lysp_ext_instance *)0x0;
          while( true ) {
            plVar4 = type_p->range->exts;
            if (plVar4 == (lysp_ext_instance *)0x0) {
              plVar16 = (lysp_ext_instance *)0x0;
            }
            else {
              plVar16 = plVar4[-1].exts;
            }
            if (plVar16 <= plVar15) break;
            plVar13 = (lysc_range *)plVar12->name;
            plVar14 = plVar13->exts;
            pvVar22 = plVar14[-1].compiled;
            plVar14[-1].compiled = (void *)((long)pvVar22 + 1);
            LVar11 = lys_compile_ext(ctx,(lysp_ext_instance *)((long)&plVar4->name + lVar21),
                                     plVar14 + (-(ulong)(plVar14 == (lysc_ext_instance *)0x0) |
                                               (ulong)pvVar22),plVar13);
            if (LVar11 != LY_SUCCESS) {
              if (LVar11 != LY_ENOT) goto LAB_00149c41;
              ppvVar1 = &((lysc_range *)plVar12->name)->exts[-1].compiled;
              *ppvVar1 = (void *)((long)*ppvVar1 + -1);
            }
            plVar15 = (lysp_ext_instance *)((long)&plVar15->name + 1);
            lVar21 = lVar21 + 0x70;
            LVar11 = LY_SUCCESS;
          }
          goto LAB_00149888;
        }
        goto LAB_0014988a;
      }
    }
    break;
  case LY_TYPE_UINT64:
    plVar12 = *type;
    if (type_p->length == (lysp_restr *)0x0) {
      LVar11 = LY_SUCCESS;
      if ((base != (lysc_type *)0x0) &&
         (LVar11 = LY_SUCCESS, (lysc_range *)base[1].name != (lysc_range *)0x0)) {
        plVar13 = lysc_range_dup(ctx,(lysc_range *)base[1].name,tpdf_chain,tpdf_chain_last);
        plVar12[1].name = (char *)plVar13;
      }
      goto LAB_00148b84;
    }
    if (base == (lysc_type *)0x0) {
      plVar13 = (lysc_range *)0x0;
    }
    else {
      plVar13 = (lysc_range *)base[1].name;
    }
    range = plVar12 + 1;
    LVar11 = LY_SUCCESS;
    LVar9 = lys_compile_type_range
                      (ctx,type_p->length,LY_TYPE_STRING,'\x01','\0',plVar13,(lysc_range **)range);
    if (LVar9 != LY_SUCCESS) goto LAB_001485f0;
    if ((tpdfname != (char *)0x0) ||
       (plVar15 = type_p->length->exts, plVar15 == (lysp_ext_instance *)0x0)) {
LAB_00148b84:
      if (type_p->patterns != (lysp_restr *)0x0) {
        if (base == (lysc_type *)0x0) {
          plVar14 = (lysc_ext_instance *)0x0;
        }
        else {
          plVar14 = base[1].exts;
        }
        LVar9 = lys_compile_type_patterns
                          (ctx,type_p->patterns,(lysc_pattern **)plVar14,
                           (lysc_pattern ***)&plVar12[1].exts);
        goto LAB_00148f6f;
      }
      if ((base != (lysc_type *)0x0) && (base[1].exts != (lysc_ext_instance *)0x0)) {
        plVar14 = (lysc_ext_instance *)lysc_patterns_dup(ctx->ctx,(lysc_pattern **)base[1].exts);
        plVar12[1].exts = plVar14;
      }
      break;
    }
    plVar14 = ((lysc_range *)range->name)->exts;
    if (plVar14 == (lysc_ext_instance *)0x0) {
      pvVar22 = (void *)0x0;
      plVar17 = (long *)calloc(1,(long)plVar15[-1].exts * 0x48 + 8);
    }
    else {
      pvVar22 = plVar14[-1].compiled;
      plVar17 = (long *)realloc(&plVar14[-1].compiled,
                                ((long)&(plVar15[-1].exts)->name +
                                (long)plVar14[-1].compiled + (long)pvVar22) * 0x48 + 8);
    }
    if (plVar17 == (long *)0x0) {
      bVar5 = false;
      LVar11 = LY_EMEM;
      ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_compile_type_");
      bVar6 = true;
    }
    else {
      ((lysc_range *)range->name)->exts = (lysc_ext_instance *)(plVar17 + 1);
      plVar14 = ((lysc_range *)range->name)->exts;
      bVar5 = true;
      if (plVar14 == (lysc_ext_instance *)0x0) {
        bVar6 = false;
        LVar11 = LY_SUCCESS;
      }
      else {
        plVar15 = type_p->length->exts;
        bVar6 = false;
        if (plVar15 == (lysp_ext_instance *)0x0) {
          plVar15 = (lysp_ext_instance *)0x0;
        }
        else {
          plVar15 = plVar15[-1].exts;
        }
        memset(plVar14 + *plVar17,0,((long)&plVar15->name + (long)pvVar22) * 0x48);
        LVar11 = LY_SUCCESS;
      }
    }
    if (bVar5) {
      lVar21 = 0;
      plVar15 = (lysp_ext_instance *)0x0;
      while( true ) {
        plVar4 = type_p->length->exts;
        if (plVar4 == (lysp_ext_instance *)0x0) {
          plVar16 = (lysp_ext_instance *)0x0;
        }
        else {
          plVar16 = plVar4[-1].exts;
        }
        if (plVar16 <= plVar15) break;
        plVar13 = (lysc_range *)range->name;
        plVar14 = plVar13->exts;
        pvVar22 = plVar14[-1].compiled;
        plVar14[-1].compiled = (void *)((long)pvVar22 + 1);
        LVar11 = lys_compile_ext(ctx,(lysp_ext_instance *)((long)&plVar4->name + lVar21),
                                 plVar14 + (-(ulong)(plVar14 == (lysc_ext_instance *)0x0) |
                                           (ulong)pvVar22),plVar13);
        if (LVar11 != LY_SUCCESS) {
          if (LVar11 != LY_ENOT) {
            bVar6 = true;
            goto LAB_0014971f;
          }
          ppvVar1 = &((lysc_range *)range->name)->exts[-1].compiled;
          *ppvVar1 = (void *)((long)*ppvVar1 + -1);
        }
        plVar15 = (lysp_ext_instance *)((long)&plVar15->name + 1);
        lVar21 = lVar21 + 0x70;
        LVar11 = LY_SUCCESS;
      }
      bVar6 = false;
    }
LAB_0014971f:
    LVar9 = LVar11;
    if (!bVar6) goto LAB_00148b84;
    goto joined_r0x00149891;
  case LY_TYPE_STRING:
    plVar12 = *type;
    enums_p = type_p->bits;
    if (enums_p == (lysp_type_enum *)0x0) {
      if (base == (lysc_type *)0x0) {
        plVar25 = ctx->ctx;
        if (tpdfname == (char *)0x0) {
          tpdfname = "";
          pcVar19 = "bit";
          pcVar26 = "bits type";
        }
        else {
          pcVar19 = "bit";
          pcVar26 = "bits type ";
        }
LAB_00149251:
        ly_vlog(plVar25,(char *)0x0,LYVE_SYNTAX_YANG,"Missing %s substatement for %s%s.",pcVar19,
                pcVar26,tpdfname);
LAB_0014925f:
        LVar9 = LY_EVALID;
        goto LAB_001485f0;
      }
      uVar27 = (ulong)tpdf_chain->count;
      if (tpdf_chain->count <= tpdf_chain_last) {
        __assert_fail("tpdf_chain->count > tpdf_chain_last",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_node.c"
                      ,0x71e,
                      "LY_ERR lys_compile_type_(struct lysc_ctx *, struct lysp_node *, uint16_t, const char *, const struct lysp_type *, LY_DATA_TYPE, const char *, const struct lysc_type *, struct lyplg_type *, struct ly_set *, uint32_t, struct lysc_type **)"
                     );
      }
      do {
        if (*(long *)(*(long *)(tpdf_chain->field_2).dnodes[uVar27 - 1] + 0x68) != 0) {
          lVar21 = *(long *)(tpdf_chain->field_2).dnodes[uVar27 - 1] + 0x40;
          goto LAB_00148f4f;
        }
        uVar27 = uVar27 - 1;
      } while (tpdf_chain_last < uVar27);
      lVar21 = 0;
LAB_00148f4f:
      if (lVar21 == 0) {
        __assert_fail("base_type_p",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_node.c"
                      ,0x72a,
                      "LY_ERR lys_compile_type_(struct lysc_ctx *, struct lysp_node *, uint16_t, const char *, const struct lysp_type *, LY_DATA_TYPE, const char *, const struct lysc_type *, struct lyplg_type *, struct ly_set *, uint32_t, struct lysc_type **)"
                     );
      }
      enums_p = *(lysp_type_enum **)(lVar21 + 0x28);
      basetype_00 = LY_TYPE_BITS;
LAB_00148f68:
      plVar12 = plVar12 + 1;
      base_enums = (lysc_type_bitenum_item *)0x0;
    }
    else {
      if (base == (lysc_type *)0x0) {
        base_enums = (lysc_type_bitenum_item *)0x0;
      }
      else {
        base_enums = (lysc_type_bitenum_item *)base[1].name;
      }
      plVar12 = plVar12 + 1;
      basetype_00 = LY_TYPE_BITS;
    }
    goto LAB_00148f6a;
  case LY_TYPE_BOOL:
    plVar12 = *type;
    uVar7 = type_p->fraction_digits;
    if (base == (lysc_type *)0x0) {
      if (uVar7 == '\0') {
        plVar25 = ctx->ctx;
        if (tpdfname == (char *)0x0) {
          tpdfname = "";
          pcVar19 = "fraction-digits";
          pcVar26 = "decimal64 type";
        }
        else {
          pcVar19 = "fraction-digits";
          pcVar26 = "decimal64 type ";
        }
        goto LAB_00149251;
      }
    }
    else {
      if (uVar7 != '\0') {
        plVar25 = ctx->ctx;
        if (tpdfname != (char *)0x0) {
          pcVar19 = 
          "Invalid fraction-digits substatement for type \"%s\" not directly derived from decimal64 built-in type."
          ;
          goto LAB_00148918;
        }
        pcVar19 = 
        "Invalid fraction-digits substatement for type not directly derived from decimal64 built-in type."
        ;
LAB_00148e5a:
        LVar20 = LYVE_SYNTAX_YANG;
LAB_00148e61:
        ly_vlog(plVar25,(char *)0x0,LVar20,pcVar19);
        goto LAB_0014925f;
      }
      uVar7 = *(uint8_t *)&base[1].name;
    }
    *(uint8_t *)&plVar12[1].name = uVar7;
    LVar11 = LVar9;
    if (type_p->range != (lysp_restr *)0x0) {
      if (base == (lysc_type *)0x0) {
        plVar14 = (lysc_ext_instance *)0x0;
      }
      else {
        plVar14 = base[1].exts;
      }
      range_00 = &plVar12[1].exts;
      LVar11 = LY_SUCCESS;
      LVar9 = lys_compile_type_range
                        (ctx,type_p->range,LY_TYPE_DEC64,'\0',*(uint8_t *)&plVar12[1].name,
                         (lysc_range *)plVar14,(lysc_range **)range_00);
      if (LVar9 != LY_SUCCESS) goto LAB_001485f0;
      if ((tpdfname == (char *)0x0) &&
         (plVar15 = type_p->range->exts, LVar11 = LY_SUCCESS, plVar15 != (lysp_ext_instance *)0x0))
      {
        lVar21 = *(long *)&(*range_00)->parent_stmt;
        if (lVar21 == 0) {
          lVar28 = 0;
          plVar17 = (long *)calloc(1,(long)plVar15[-1].exts * 0x48 + 8);
        }
        else {
          lVar28 = *(long *)(lVar21 + -8);
          plVar17 = (long *)realloc((void *)(lVar21 + -8),
                                    ((long)&(plVar15[-1].exts)->name +
                                    *(long *)(lVar21 + -8) + lVar28) * 0x48 + 8);
        }
        if (plVar17 == (long *)0x0) {
          bVar5 = false;
          LVar11 = LY_EMEM;
          ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_compile_type_");
          bVar6 = true;
        }
        else {
          *(long **)&(*range_00)->parent_stmt = plVar17 + 1;
          bVar5 = true;
          if (*(long *)&(*range_00)->parent_stmt != 0) {
            plVar15 = type_p->range->exts;
            if (plVar15 == (lysp_ext_instance *)0x0) {
              plVar15 = (lysp_ext_instance *)0x0;
            }
            else {
              plVar15 = plVar15[-1].exts;
            }
            memset((void *)(*(long *)&(*range_00)->parent_stmt + *plVar17 * 0x48),0,
                   ((long)&plVar15->name + lVar28) * 0x48);
          }
          bVar6 = false;
          LVar11 = LY_SUCCESS;
        }
        if (bVar5) {
          lVar21 = 0;
          plVar15 = (lysp_ext_instance *)0x0;
          while( true ) {
            plVar4 = type_p->range->exts;
            if (plVar4 == (lysp_ext_instance *)0x0) {
              plVar16 = (lysp_ext_instance *)0x0;
            }
            else {
              plVar16 = plVar4[-1].exts;
            }
            if (plVar16 <= plVar15) break;
            plVar14 = *range_00;
            lVar28 = *(long *)&plVar14->parent_stmt;
            uVar27 = *(ulong *)(lVar28 + -8);
            *(ulong *)(lVar28 + -8) = uVar27 + 1;
            LVar11 = lys_compile_ext(ctx,(lysp_ext_instance *)((long)&plVar4->name + lVar21),
                                     (lysc_ext_instance *)
                                     (lVar28 + (-(ulong)(lVar28 == 0) | uVar27) * 0x48),plVar14);
            if (LVar11 != LY_SUCCESS) {
              if (LVar11 != LY_ENOT) goto LAB_00149c41;
              lVar28 = *(long *)&(*range_00)->parent_stmt + -8;
              *(long *)lVar28 = *(long *)lVar28 + -1;
            }
            plVar15 = (lysp_ext_instance *)((long)&plVar15->name + 1);
            lVar21 = lVar21 + 0x70;
            LVar11 = LY_SUCCESS;
          }
          goto LAB_00149888;
        }
        goto LAB_0014988a;
      }
    }
    break;
  case LY_TYPE_EMPTY:
    plVar12 = *type;
    enums_p = type_p->enums;
    if (enums_p == (lysp_type_enum *)0x0) {
      if (base == (lysc_type *)0x0) {
        plVar25 = ctx->ctx;
        if (tpdfname == (char *)0x0) {
          tpdfname = "";
          pcVar19 = "enum";
          pcVar26 = "enumeration type";
        }
        else {
          pcVar19 = "enum";
          pcVar26 = "enumeration type ";
        }
        goto LAB_00149251;
      }
      uVar27 = (ulong)tpdf_chain->count;
      if (tpdf_chain->count <= tpdf_chain_last) {
        __assert_fail("tpdf_chain->count > tpdf_chain_last",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_node.c"
                      ,0x781,
                      "LY_ERR lys_compile_type_(struct lysc_ctx *, struct lysp_node *, uint16_t, const char *, const struct lysp_type *, LY_DATA_TYPE, const char *, const struct lysc_type *, struct lyplg_type *, struct ly_set *, uint32_t, struct lysc_type **)"
                     );
      }
      do {
        if (*(long *)(*(long *)(tpdf_chain->field_2).dnodes[uVar27 - 1] + 0x60) != 0) {
          lVar21 = *(long *)(tpdf_chain->field_2).dnodes[uVar27 - 1] + 0x40;
          goto LAB_00148f30;
        }
        uVar27 = uVar27 - 1;
      } while (tpdf_chain_last < uVar27);
      lVar21 = 0;
LAB_00148f30:
      if (lVar21 == 0) {
        __assert_fail("base_type_p",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_node.c"
                      ,0x78d,
                      "LY_ERR lys_compile_type_(struct lysc_ctx *, struct lysp_node *, uint16_t, const char *, const struct lysp_type *, LY_DATA_TYPE, const char *, const struct lysc_type *, struct lyplg_type *, struct ly_set *, uint32_t, struct lysc_type **)"
                     );
      }
      enums_p = *(lysp_type_enum **)(lVar21 + 0x20);
      basetype_00 = LY_TYPE_ENUM;
      goto LAB_00148f68;
    }
    if (base == (lysc_type *)0x0) {
      base_enums = (lysc_type_bitenum_item *)0x0;
    }
    else {
      base_enums = (lysc_type_bitenum_item *)base[1].name;
    }
    plVar12 = plVar12 + 1;
    basetype_00 = LY_TYPE_ENUM;
LAB_00148f6a:
    LVar9 = lys_compile_type_enums
                      (ctx,enums_p,basetype_00,base_enums,(lysc_type_bitenum_item **)plVar12);
LAB_00148f6f:
    LVar11 = LY_SUCCESS;
    LVar10 = LVar9;
joined_r0x00148d6a:
    if (LVar10 != LY_SUCCESS) goto LAB_001485f0;
    break;
  case LY_TYPE_ENUM:
    plVar12 = *type;
    if (type_p->bases == (char **)0x0) {
      if (base == (lysc_type *)0x0) {
        plVar25 = ctx->ctx;
        if (tpdfname == (char *)0x0) {
          tpdfname = "";
          pcVar19 = "base";
          pcVar26 = "identityref type";
        }
        else {
          pcVar19 = "base";
          pcVar26 = "identityref type ";
        }
        goto LAB_00149251;
      }
      pcVar19 = plVar12[1].name;
      if (pcVar19 == (char *)0x0) {
        if (base[1].name == (char *)0x0) {
          sVar24 = 8;
        }
        else {
          sVar24 = *(long *)(base[1].name + -8) * 8 + 8;
        }
        plVar17 = (long *)calloc(1,sVar24);
      }
      else {
        if (base[1].name == (char *)0x0) {
          lVar21 = 0;
        }
        else {
          lVar21 = *(long *)(base[1].name + -8);
        }
        plVar17 = (long *)realloc(pcVar19 + -8,(lVar21 + *(long *)(pcVar19 + -8)) * 8 + 8);
      }
      if (plVar17 == (long *)0x0) {
        bVar5 = false;
        LVar11 = LY_EMEM;
        ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_compile_type_");
        bVar6 = true;
      }
      else {
        plVar12[1].name = (char *)(plVar17 + 1);
        bVar6 = false;
        if (base[1].name == (char *)0x0) {
          sVar24 = 0;
        }
        else {
          sVar24 = *(long *)(base[1].name + -8) << 3;
        }
        memset(plVar17 + *plVar17 + 1,0,sVar24);
        bVar5 = true;
        LVar11 = LY_SUCCESS;
      }
      if (!bVar5) goto LAB_0014988a;
      uVar27 = 0;
      while( true ) {
        pcVar19 = base[1].name;
        if (pcVar19 == (char *)0x0) {
          uVar23 = 0;
        }
        else {
          uVar23 = *(ulong *)(pcVar19 + -8);
        }
        if (uVar23 <= uVar27) break;
        *(undefined8 *)(plVar12[1].name + uVar27 * 8) = *(undefined8 *)(pcVar19 + uVar27 * 8);
        *(long *)(plVar12[1].name + -8) = *(long *)(plVar12[1].name + -8) + 1;
        uVar27 = uVar27 + 1;
      }
LAB_00149888:
      bVar6 = false;
      goto LAB_0014988a;
    }
    if (base != (lysc_type *)0x0) {
      plVar25 = ctx->ctx;
      if (tpdfname == (char *)0x0) {
        pcVar19 = 
        "Invalid base substatement for the type not directly derived from identityref built-in type."
        ;
        goto LAB_00148e5a;
      }
      pcVar19 = 
      "Invalid base substatement for the type \"%s\" not directly derived from identityref built-in type."
      ;
LAB_00148918:
      LVar20 = LYVE_SYNTAX_YANG;
LAB_0014891f:
      ly_vlog(plVar25,(char *)0x0,LVar20,pcVar19,tpdfname);
      goto LAB_0014925f;
    }
    LVar9 = lys_compile_identity_bases
                      (ctx,type_p->pmod,type_p->bases,(lysc_ident *)0x0,
                       (lysc_ident ***)(plVar12 + 1));
    goto LAB_00148f6f;
  case LY_TYPE_IDENT:
    if ((type_p->flags & 0x200) == 0) {
      *(undefined1 *)&(*type)[1].name = 1;
      LVar11 = LVar9;
    }
    else {
      *(uint8_t *)&(*type)[1].name = type_p->require_instance;
      LVar11 = LVar9;
    }
    break;
  case LY_TYPE_INST:
    plVar12 = *type;
    if ((type_p->flags & 0x200) == 0) {
      if (base == (lysc_type *)0x0) {
        uVar8 = LY_TYPE_BINARY;
      }
      else {
        uVar8 = (undefined1)base[1].basetype;
      }
    }
    else {
      if (type_p->pmod->version < 2) {
        plVar25 = ctx->ctx;
        if (tpdfname == (char *)0x0) {
          pcVar19 = 
          "Leafref type can be restricted by require-instance statement only in YANG 1.1 modules.";
          LVar20 = LYVE_SEMANTICS;
          goto LAB_00148e61;
        }
        pcVar19 = 
        "Leafref type \"%s\" can be restricted by require-instance statement only in YANG 1.1 modules."
        ;
        LVar20 = LYVE_SEMANTICS;
        goto LAB_0014891f;
      }
      uVar8 = type_p->require_instance;
    }
    *(undefined1 *)&plVar12[1].basetype = uVar8;
    if (type_p->path == (lyxp_expr *)0x0) {
      if (base == (lysc_type *)0x0) {
        plVar25 = ctx->ctx;
        if (tpdfname == (char *)0x0) {
          tpdfname = "";
          pcVar19 = "path";
          pcVar26 = "leafref type";
        }
        else {
          pcVar19 = "path";
          pcVar26 = "leafref type ";
        }
        goto LAB_00149251;
      }
      LVar9 = lyxp_expr_dup(ctx->ctx,(lyxp_expr *)base[1].name,0,0,(lyxp_expr **)(plVar12 + 1));
      if (LVar9 != LY_SUCCESS) goto LAB_001485f0;
      LVar9 = lyplg_type_prefix_data_dup
                        (ctx->ctx,LY_VALUE_SCHEMA_RESOLVED,base[1].exts,&plVar12[1].exts);
      LVar11 = LY_SUCCESS;
      LVar10 = LVar9;
    }
    else {
      LVar9 = lyxp_expr_dup(ctx->ctx,type_p->path,0,0,(lyxp_expr **)(plVar12 + 1));
      if (LVar9 != LY_SUCCESS) goto LAB_001485f0;
      plVar25 = ctx->ctx;
      pcVar19 = type_p->path->expr;
      sVar24 = strlen(pcVar19);
      LVar10 = lyplg_type_prefix_data_new
                         (plVar25,pcVar19,sVar24,LY_VALUE_SCHEMA,type_p->pmod,&local_34,
                          &plVar12[1].exts);
      LVar11 = LVar9;
    }
    goto joined_r0x00148d6a;
  case LY_TYPE_LEAFREF:
    plVar12 = *type;
    if (type_p->types != (lysp_type *)0x0) {
      if (base != (lysc_type *)0x0) {
        plVar25 = ctx->ctx;
        if (tpdfname == (char *)0x0) {
          pcVar19 = 
          "Invalid type substatement for the type not directly derived from union built-in type.";
          goto LAB_00148e5a;
        }
        pcVar19 = 
        "Invalid type substatement for the type \"%s\" not directly derived from union built-in type."
        ;
        goto LAB_00148918;
      }
      LVar9 = lys_compile_type_union
                        (ctx,type_p->types,context_pnode,context_flags,context_name,
                         (lysc_type ***)(plVar12 + 1));
      goto LAB_00148f6f;
    }
    if (base == (lysc_type *)0x0) {
      plVar25 = ctx->ctx;
      if (tpdfname == (char *)0x0) {
        tpdfname = "";
        pcVar19 = "type";
        pcVar26 = "union type";
      }
      else {
        pcVar19 = "type";
        pcVar26 = "union type ";
      }
      goto LAB_00149251;
    }
    pcVar19 = plVar12[1].name;
    if (pcVar19 == (char *)0x0) {
      if (base[1].name == (char *)0x0) {
        sVar24 = 8;
      }
      else {
        sVar24 = *(long *)(base[1].name + -8) * 8 + 8;
      }
      plVar17 = (long *)calloc(1,sVar24);
    }
    else {
      if (base[1].name == (char *)0x0) {
        lVar21 = 0;
      }
      else {
        lVar21 = *(long *)(base[1].name + -8);
      }
      plVar17 = (long *)realloc(pcVar19 + -8,(lVar21 + *(long *)(pcVar19 + -8)) * 8 + 8);
    }
    if (plVar17 == (long *)0x0) {
      bVar5 = false;
      LVar11 = LY_EMEM;
      ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_compile_type_");
      bVar6 = true;
    }
    else {
      plVar12[1].name = (char *)(plVar17 + 1);
      bVar6 = false;
      if (base[1].name == (char *)0x0) {
        sVar24 = 0;
      }
      else {
        sVar24 = *(long *)(base[1].name + -8) << 3;
      }
      memset(plVar17 + *plVar17 + 1,0,sVar24);
      bVar5 = true;
      LVar11 = LY_SUCCESS;
    }
    if (bVar5) {
      uVar27 = 0;
      while( true ) {
        pcVar19 = base[1].name;
        if (pcVar19 == (char *)0x0) {
          uVar23 = 0;
        }
        else {
          uVar23 = *(ulong *)(pcVar19 + -8);
        }
        if (uVar23 <= uVar27) break;
        *(undefined8 *)(plVar12[1].name + uVar27 * 8) = *(undefined8 *)(pcVar19 + uVar27 * 8);
        LOCK();
        piVar2 = (int *)(*(long *)(plVar12[1].name + uVar27 * 8) + 0x1c);
        *piVar2 = *piVar2 + 1;
        UNLOCK();
        *(long *)(plVar12[1].name + -8) = *(long *)(plVar12[1].name + -8) + 1;
        uVar27 = uVar27 + 1;
      }
      goto LAB_00149888;
    }
LAB_0014988a:
    LVar9 = LVar11;
    if (!bVar6) break;
joined_r0x00149891:
    if (!bVar6) {
      return LVar9;
    }
    goto LAB_001485f0;
  }
  uVar27 = (ulong)tpdf_chain->count;
  LVar9 = LVar11;
  if (tpdf_chain_last < tpdf_chain->count) {
    do {
      plVar3 = (tpdf_chain->field_2).dnodes[uVar27 - 1];
      lVar21 = *(long *)(*(long *)plVar3 + 0x88);
      if (lVar21 != 0) {
        plVar14 = (*type)->exts;
        if (plVar14 == (lysc_ext_instance *)0x0) {
          pvVar22 = (void *)0x0;
          plVar17 = (long *)calloc(1,*(long *)(lVar21 + -8) * 0x48 + 8);
        }
        else {
          pvVar22 = plVar14[-1].compiled;
          plVar17 = (long *)realloc(&plVar14[-1].compiled,
                                    ((long)plVar14[-1].compiled + (long)pvVar22 +
                                    *(long *)(lVar21 + -8)) * 0x48 + 8);
        }
        if (plVar17 == (long *)0x0) {
          bVar5 = false;
          LVar11 = LY_EMEM;
          ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_compile_type_");
          bVar6 = true;
        }
        else {
          (*type)->exts = (lysc_ext_instance *)(plVar17 + 1);
          bVar5 = true;
          if ((*type)->exts == (lysc_ext_instance *)0x0) {
            bVar6 = false;
          }
          else {
            if (*(long *)(*(long *)plVar3 + 0x88) == 0) {
              lVar21 = 0;
            }
            else {
              lVar21 = *(long *)(*(long *)(*(long *)plVar3 + 0x88) + -8);
            }
            bVar6 = false;
            memset((*type)->exts + *plVar17,0,(lVar21 + (long)pvVar22) * 0x48);
          }
        }
        if (bVar5) {
          lVar21 = 0;
          uVar23 = 0;
          while( true ) {
            lVar28 = *(long *)(*(long *)plVar3 + 0x88);
            if (lVar28 == 0) {
              uVar18 = 0;
            }
            else {
              uVar18 = *(ulong *)(lVar28 + -8);
            }
            if (uVar18 <= uVar23) break;
            plVar12 = *type;
            plVar14 = plVar12->exts;
            pvVar22 = plVar14[-1].compiled;
            plVar14[-1].compiled = (void *)((long)pvVar22 + 1);
            LVar11 = lys_compile_ext(ctx,(lysp_ext_instance *)(lVar28 + lVar21),
                                     plVar14 + (-(ulong)(plVar14 == (lysc_ext_instance *)0x0) |
                                               (ulong)pvVar22),plVar12);
            if (LVar11 != LY_SUCCESS) {
              if (LVar11 != LY_ENOT) {
                bVar6 = true;
                goto LAB_00149a6c;
              }
              ppvVar1 = &(*type)->exts[-1].compiled;
              *ppvVar1 = (void *)((long)*ppvVar1 + -1);
            }
            uVar23 = uVar23 + 1;
            lVar21 = lVar21 + 0x70;
            LVar11 = LY_SUCCESS;
          }
          bVar6 = false;
        }
LAB_00149a6c:
        LVar9 = LVar11;
        if (bVar6) goto joined_r0x00149891;
      }
      uVar27 = uVar27 - 1;
      LVar9 = LVar11;
    } while (tpdf_chain_last < uVar27);
  }
  plVar15 = type_p->exts;
  if (plVar15 != (lysp_ext_instance *)0x0) {
    plVar14 = (*type)->exts;
    if (plVar14 == (lysc_ext_instance *)0x0) {
      pvVar22 = (void *)0x0;
      plVar17 = (long *)calloc(1,(long)plVar15[-1].exts * 0x48 + 8);
    }
    else {
      pvVar22 = plVar14[-1].compiled;
      plVar17 = (long *)realloc(&plVar14[-1].compiled,
                                ((long)&(plVar15[-1].exts)->name +
                                (long)plVar14[-1].compiled + (long)pvVar22) * 0x48 + 8);
    }
    if (plVar17 == (long *)0x0) {
      bVar5 = false;
      LVar9 = LY_EMEM;
      ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_compile_type_");
    }
    else {
      (*type)->exts = (lysc_ext_instance *)(plVar17 + 1);
      bVar5 = true;
      if ((*type)->exts != (lysc_ext_instance *)0x0) {
        if (type_p->exts == (lysp_ext_instance *)0x0) {
          plVar15 = (lysp_ext_instance *)0x0;
        }
        else {
          plVar15 = type_p->exts[-1].exts;
        }
        memset((*type)->exts + *plVar17,0,((long)&plVar15->name + (long)pvVar22) * 0x48);
      }
    }
    if (bVar5) {
      lVar21 = 0;
      plVar15 = (lysp_ext_instance *)0x0;
      do {
        plVar4 = type_p->exts;
        if (plVar4 == (lysp_ext_instance *)0x0) {
          plVar16 = (lysp_ext_instance *)0x0;
        }
        else {
          plVar16 = plVar4[-1].exts;
        }
        if (plVar16 <= plVar15) break;
        plVar12 = *type;
        plVar14 = plVar12->exts;
        pvVar22 = plVar14[-1].compiled;
        plVar14[-1].compiled = (void *)((long)pvVar22 + 1);
        LVar9 = lys_compile_ext(ctx,(lysp_ext_instance *)((long)&plVar4->name + lVar21),
                                plVar14 + (-(ulong)(plVar14 == (lysc_ext_instance *)0x0) |
                                          (ulong)pvVar22),plVar12);
        if (LVar9 != LY_SUCCESS) {
          if (LVar9 != LY_ENOT) break;
          ppvVar1 = &(*type)->exts[-1].compiled;
          *ppvVar1 = (void *)((long)*ppvVar1 + -1);
        }
        plVar15 = (lysp_ext_instance *)((long)&plVar15->name + 1);
        lVar21 = lVar21 + 0x70;
        LVar9 = LY_SUCCESS;
      } while( true );
    }
  }
LAB_001485f0:
  if (LVar9 != LY_SUCCESS) {
    LOCK();
    (*type)->refcount = (*type)->refcount + 1;
    UNLOCK();
    lysc_type_free(&ctx->free_ctx,*type);
    *type = (lysc_type *)0x0;
  }
  return LVar9;
LAB_00149c41:
  bVar6 = true;
  goto LAB_0014988a;
}

Assistant:

static LY_ERR
lys_compile_type_(struct lysc_ctx *ctx, struct lysp_node *context_pnode, uint16_t context_flags, const char *context_name,
        const struct lysp_type *type_p, LY_DATA_TYPE basetype, const char *tpdfname, const struct lysc_type *base,
        struct lyplg_type *plugin, struct ly_set *tpdf_chain, uint32_t tpdf_chain_last, struct lysc_type **type)
{
    LY_ERR rc = LY_SUCCESS;
    struct lysc_type_bin *bin;
    struct lysc_type_num *num;
    struct lysc_type_str *str;
    struct lysc_type_bits *bits;
    struct lysc_type_enum *enumeration;
    struct lysc_type_dec *dec;
    struct lysc_type_identityref *idref;
    struct lysc_type_leafref *lref;
    struct lysc_type_union *un;
    struct lys_type_item *tpdf_item;
    const struct lysp_type *base_type_p;
    uint32_t i;

    /* alloc and init */
    rc = lys_new_type(ctx->ctx, basetype, tpdfname, type);
    LY_CHECK_GOTO(rc, cleanup);

    (*type)->basetype = basetype;
    (*type)->plugin = plugin;

    switch (basetype) {
    case LY_TYPE_BINARY:
        bin = (struct lysc_type_bin *)*type;

        /* RFC 7950 9.8.1, 9.4.4 - length, number of octets it contains */
        if (type_p->length) {
            LY_CHECK_GOTO(rc = lys_compile_type_range(ctx, type_p->length, basetype, 1, 0,
                    base ? ((struct lysc_type_bin *)base)->length : NULL, &bin->length), cleanup);
            if (!tpdfname) {
                COMPILE_EXTS_GOTO(ctx, type_p->length->exts, bin->length->exts, bin->length, rc, cleanup);
            }
        }
        break;
    case LY_TYPE_BITS:
        /* RFC 7950 9.7 - bits */
        bits = (struct lysc_type_bits *)*type;
        if (type_p->bits) {
            /* compile bits from this type */
            LY_CHECK_GOTO(rc = lys_compile_type_enums(ctx, type_p->bits, basetype,
                    base ? (struct lysc_type_bitenum_item *)((struct lysc_type_bits *)base)->bits : NULL,
                    (struct lysc_type_bitenum_item **)&bits->bits), cleanup);
        } else if (base) {
            /* recompile bits from the first superior type with bits */
            assert(tpdf_chain->count > tpdf_chain_last);
            base_type_p = NULL;
            i = tpdf_chain->count;
            do {
                --i;
                tpdf_item = tpdf_chain->objs[i];

                if (tpdf_item->tpdf->type.bits) {
                    base_type_p = &tpdf_item->tpdf->type;
                    break;
                }
            } while (i > tpdf_chain_last);
            assert(base_type_p);

            LY_CHECK_GOTO(rc = lys_compile_type_enums(ctx, base_type_p->bits, basetype, NULL,
                    (struct lysc_type_bitenum_item **)&bits->bits), cleanup);
        } else {
            /* type derived from bits built-in type must contain at least one bit */
            if (tpdfname) {
                LOGVAL(ctx->ctx, LY_VCODE_MISSCHILDSTMT, "bit", "bits type ", tpdfname);
            } else {
                LOGVAL(ctx->ctx, LY_VCODE_MISSCHILDSTMT, "bit", "bits type", "");
            }
            rc = LY_EVALID;
            goto cleanup;
        }
        break;
    case LY_TYPE_DEC64:
        dec = (struct lysc_type_dec *)*type;

        /* RFC 7950 9.3.4 - fraction-digits */
        if (!base) {
            if (!type_p->fraction_digits) {
                if (tpdfname) {
                    LOGVAL(ctx->ctx, LY_VCODE_MISSCHILDSTMT, "fraction-digits", "decimal64 type ", tpdfname);
                } else {
                    LOGVAL(ctx->ctx, LY_VCODE_MISSCHILDSTMT, "fraction-digits", "decimal64 type", "");
                }
                rc = LY_EVALID;
                goto cleanup;
            }
            dec->fraction_digits = type_p->fraction_digits;
        } else {
            if (type_p->fraction_digits) {
                /* fraction digits is prohibited in types not directly derived from built-in decimal64 */
                if (tpdfname) {
                    LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                            "Invalid fraction-digits substatement for type \"%s\" not directly derived from decimal64 built-in type.",
                            tpdfname);
                } else {
                    LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                            "Invalid fraction-digits substatement for type not directly derived from decimal64 built-in type.");
                }
                rc = LY_EVALID;
                goto cleanup;
            }
            dec->fraction_digits = ((struct lysc_type_dec *)base)->fraction_digits;
        }

        /* RFC 7950 9.2.4 - range */
        if (type_p->range) {
            LY_CHECK_GOTO(rc = lys_compile_type_range(ctx, type_p->range, basetype, 0, dec->fraction_digits,
                    base ? ((struct lysc_type_dec *)base)->range : NULL, &dec->range), cleanup);
            if (!tpdfname) {
                COMPILE_EXTS_GOTO(ctx, type_p->range->exts, dec->range->exts, dec->range, rc, cleanup);
            }
        }
        break;
    case LY_TYPE_STRING:
        str = (struct lysc_type_str *)*type;

        /* RFC 7950 9.4.4 - length */
        if (type_p->length) {
            LY_CHECK_GOTO(rc = lys_compile_type_range(ctx, type_p->length, basetype, 1, 0,
                    base ? ((struct lysc_type_str *)base)->length : NULL, &str->length), cleanup);
            if (!tpdfname) {
                COMPILE_EXTS_GOTO(ctx, type_p->length->exts, str->length->exts, str->length, rc, cleanup);
            }
        } else if (base && ((struct lysc_type_str *)base)->length) {
            str->length = lysc_range_dup(ctx, ((struct lysc_type_str *)base)->length, tpdf_chain, tpdf_chain_last);
        }

        /* RFC 7950 9.4.5 - pattern */
        if (type_p->patterns) {
            LY_CHECK_GOTO(rc = lys_compile_type_patterns(ctx, type_p->patterns,
                    base ? ((struct lysc_type_str *)base)->patterns : NULL, &str->patterns), cleanup);
        } else if (base && ((struct lysc_type_str *)base)->patterns) {
            str->patterns = lysc_patterns_dup(ctx->ctx, ((struct lysc_type_str *)base)->patterns);
        }
        break;
    case LY_TYPE_ENUM:
        enumeration = (struct lysc_type_enum *)*type;

        /* RFC 7950 9.6 - enum */
        if (type_p->enums) {
            LY_CHECK_GOTO(rc = lys_compile_type_enums(ctx, type_p->enums, basetype,
                    base ? ((struct lysc_type_enum *)base)->enums : NULL, &enumeration->enums), cleanup);
        } else if (base) {
            /* recompile enums from the first superior type with enums */
            assert(tpdf_chain->count > tpdf_chain_last);
            base_type_p = NULL;
            i = tpdf_chain->count;
            do {
                --i;
                tpdf_item = tpdf_chain->objs[i];

                if (tpdf_item->tpdf->type.enums) {
                    base_type_p = &tpdf_item->tpdf->type;
                    break;
                }
            } while (i > tpdf_chain_last);
            assert(base_type_p);

            LY_CHECK_GOTO(rc = lys_compile_type_enums(ctx, base_type_p->enums, basetype, NULL, &enumeration->enums), cleanup);
        } else {
            /* type derived from enumerations built-in type must contain at least one enum */
            if (tpdfname) {
                LOGVAL(ctx->ctx, LY_VCODE_MISSCHILDSTMT, "enum", "enumeration type ", tpdfname);
            } else {
                LOGVAL(ctx->ctx, LY_VCODE_MISSCHILDSTMT, "enum", "enumeration type", "");
            }
            rc = LY_EVALID;
            goto cleanup;
        }
        break;
    case LY_TYPE_INT8:
    case LY_TYPE_UINT8:
    case LY_TYPE_INT16:
    case LY_TYPE_UINT16:
    case LY_TYPE_INT32:
    case LY_TYPE_UINT32:
    case LY_TYPE_INT64:
    case LY_TYPE_UINT64:
        num = (struct lysc_type_num *)*type;

        /* RFC 6020 9.2.4 - range */
        if (type_p->range) {
            LY_CHECK_GOTO(rc = lys_compile_type_range(ctx, type_p->range, basetype, 0, 0,
                    base ? ((struct lysc_type_num *)base)->range : NULL, &num->range), cleanup);
            if (!tpdfname) {
                COMPILE_EXTS_GOTO(ctx, type_p->range->exts, num->range->exts, num->range, rc, cleanup);
            }
        }
        break;
    case LY_TYPE_IDENT:
        idref = (struct lysc_type_identityref *)*type;

        /* RFC 7950 9.10.2 - base */
        if (type_p->bases) {
            if (base) {
                /* only the directly derived identityrefs can contain base specification */
                if (tpdfname) {
                    LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                            "Invalid base substatement for the type \"%s\" not directly derived from identityref built-in type.",
                            tpdfname);
                } else {
                    LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                            "Invalid base substatement for the type not directly derived from identityref built-in type.");
                }
                rc = LY_EVALID;
                goto cleanup;
            }
            LY_CHECK_GOTO(rc = lys_compile_identity_bases(ctx, type_p->pmod, type_p->bases, NULL, &idref->bases), cleanup);
        } else if (base) {
            /* copy all the bases */
            const struct lysc_type_identityref *idref_base = (struct lysc_type_identityref *)base;
            LY_ARRAY_COUNT_TYPE u;

            LY_ARRAY_CREATE_GOTO(ctx->ctx, idref->bases, LY_ARRAY_COUNT(idref_base->bases), rc, cleanup);
            LY_ARRAY_FOR(idref_base->bases, u) {
                idref->bases[u] = idref_base->bases[u];
                LY_ARRAY_INCREMENT(idref->bases);
            }
        } else {
            /* type derived from identityref built-in type must contain at least one base */
            if (tpdfname) {
                LOGVAL(ctx->ctx, LY_VCODE_MISSCHILDSTMT, "base", "identityref type ", tpdfname);
            } else {
                LOGVAL(ctx->ctx, LY_VCODE_MISSCHILDSTMT, "base", "identityref type", "");
            }
            rc = LY_EVALID;
            goto cleanup;
        }
        break;
    case LY_TYPE_LEAFREF:
        lref = (struct lysc_type_leafref *)*type;

        /* RFC 7950 9.9.3 - require-instance */
        if (type_p->flags & LYS_SET_REQINST) {
            if (type_p->pmod->version < LYS_VERSION_1_1) {
                if (tpdfname) {
                    LOGVAL(ctx->ctx, LYVE_SEMANTICS,
                            "Leafref type \"%s\" can be restricted by require-instance statement only in YANG 1.1 modules.", tpdfname);
                } else {
                    LOGVAL(ctx->ctx, LYVE_SEMANTICS,
                            "Leafref type can be restricted by require-instance statement only in YANG 1.1 modules.");
                }
                rc = LY_EVALID;
                goto cleanup;
            }
            lref->require_instance = type_p->require_instance;
        } else if (base) {
            /* inherit */
            lref->require_instance = ((struct lysc_type_leafref *)base)->require_instance;
        } else {
            /* default is true */
            lref->require_instance = 1;
        }
        if (type_p->path) {
            LY_VALUE_FORMAT format;

            LY_CHECK_GOTO(rc = lyxp_expr_dup(ctx->ctx, type_p->path, 0, 0, &lref->path), cleanup);
            LY_CHECK_GOTO(lyplg_type_prefix_data_new(ctx->ctx, type_p->path->expr, strlen(type_p->path->expr),
                    LY_VALUE_SCHEMA, type_p->pmod, &format, (void **)&lref->prefixes), cleanup);
        } else if (base) {
            LY_CHECK_GOTO(rc = lyxp_expr_dup(ctx->ctx, ((struct lysc_type_leafref *)base)->path, 0, 0, &lref->path), cleanup);
            LY_CHECK_GOTO(rc = lyplg_type_prefix_data_dup(ctx->ctx, LY_VALUE_SCHEMA_RESOLVED,
                    ((struct lysc_type_leafref *)base)->prefixes, (void **)&lref->prefixes), cleanup);
        } else {
            /* type derived from leafref built-in type must contain path */
            if (tpdfname) {
                LOGVAL(ctx->ctx, LY_VCODE_MISSCHILDSTMT, "path", "leafref type ", tpdfname);
            } else {
                LOGVAL(ctx->ctx, LY_VCODE_MISSCHILDSTMT, "path", "leafref type", "");
            }
            rc = LY_EVALID;
            goto cleanup;
        }
        break;
    case LY_TYPE_INST:
        /* RFC 7950 9.9.3 - require-instance */
        if (type_p->flags & LYS_SET_REQINST) {
            ((struct lysc_type_instanceid *)*type)->require_instance = type_p->require_instance;
        } else {
            /* default is true */
            ((struct lysc_type_instanceid *)*type)->require_instance = 1;
        }
        break;
    case LY_TYPE_UNION:
        un = (struct lysc_type_union *)*type;

        /* RFC 7950 7.4 - type */
        if (type_p->types) {
            if (base) {
                /* only the directly derived union can contain types specification */
                if (tpdfname) {
                    LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                            "Invalid type substatement for the type \"%s\" not directly derived from union built-in type.",
                            tpdfname);
                } else {
                    LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                            "Invalid type substatement for the type not directly derived from union built-in type.");
                }
                rc = LY_EVALID;
                goto cleanup;
            }
            /* compile the type */
            LY_CHECK_GOTO(rc = lys_compile_type_union(ctx, type_p->types, context_pnode, context_flags, context_name,
                    &un->types), cleanup);
        } else if (base) {
            /* copy all the types */
            const struct lysc_type_union *un_base = (struct lysc_type_union *)base;
            LY_ARRAY_COUNT_TYPE u;

            LY_ARRAY_CREATE_GOTO(ctx->ctx, un->types, LY_ARRAY_COUNT(un_base->types), rc, cleanup);
            LY_ARRAY_FOR(un_base->types, u) {
                un->types[u] = un_base->types[u];
                LY_ATOMIC_INC_BARRIER(un->types[u]->refcount);
                LY_ARRAY_INCREMENT(un->types);
            }
        } else {
            /* type derived from union built-in type must contain at least one type */
            if (tpdfname) {
                LOGVAL(ctx->ctx, LY_VCODE_MISSCHILDSTMT, "type", "union type ", tpdfname);
            } else {
                LOGVAL(ctx->ctx, LY_VCODE_MISSCHILDSTMT, "type", "union type", "");
            }
            rc = LY_EVALID;
            goto cleanup;
        }
        break;
    case LY_TYPE_BOOL:
    case LY_TYPE_EMPTY:
    case LY_TYPE_UNKNOWN: /* just to complete switch */
        break;
    }

    if (tpdf_chain->count > tpdf_chain_last) {
        i = tpdf_chain->count;
        do {
            --i;
            tpdf_item = tpdf_chain->objs[i];

            /* compile previous typedefs extensions */
            COMPILE_EXTS_GOTO(ctx, tpdf_item->tpdf->type.exts, (*type)->exts, *type, rc, cleanup);
        } while (i > tpdf_chain_last);
    }

    /* compile new parsed extensions */
    COMPILE_EXTS_GOTO(ctx, type_p->exts, (*type)->exts, *type, rc, cleanup);

cleanup:
    if (rc) {
        LY_ATOMIC_INC_BARRIER((*type)->refcount);
        lysc_type_free(&ctx->free_ctx, *type);
        *type = NULL;
    }
    return rc;
}